

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::fixedColAtZero<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,double colCost,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  pointer pcVar1;
  int iVar2;
  pointer pNVar3;
  HighsInt *pHVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  long lVar8;
  double *pdVar9;
  int *piVar10;
  long lVar11;
  size_t position;
  ReductionType local_45;
  HighsInt local_44;
  double local_40;
  double local_38;
  
  pNVar3 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  lVar11 = (long)colVec->head;
  local_44 = col;
  local_38 = colCost;
  if (lVar11 != -1) {
    pHVar4 = colVec->nodeNext;
    pdVar9 = colVec->nodeValue + lVar11;
    piVar10 = colVec->nodeIndex + lVar11;
    do {
      local_40 = *pdVar9;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                  *)&this->colValues,
                 (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + *piVar10,&local_40);
      lVar8 = (long)(int)lVar11;
      lVar11 = (long)pHVar4[lVar8];
      piVar10 = piVar10 + (lVar11 - lVar8);
      pdVar9 = pdVar9 + (lVar11 - lVar8);
    } while (lVar11 != -1);
  }
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_44];
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar5 + (0x18 - (long)pcVar6)));
  pcVar7 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = pcVar5 + ((long)pcVar7 - (long)pcVar6);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(double *)(pcVar5 + (long)(pcVar7 + (8 - (long)pcVar6))) = local_38;
  *(int *)(pcVar5 + (long)(pcVar7 + (0x10 - (long)pcVar6))) = iVar2;
  pcVar5[(long)(pcVar7 + (0x14 - (long)pcVar6))] = '\x03';
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->colValues);
  local_45 = kFixedCol;
  local_40 = (double)((long)(this->reductionValues).data.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_45,(unsigned_long *)&local_40);
  return;
}

Assistant:

void fixedColAtZero(HighsInt col, double colCost,
                      const HighsMatrixSlice<ColStorageFormat>& colVec) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(
        FixedCol{0.0, colCost, origColIndex[col], HighsBasisStatus::kZero});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFixedCol);
  }